

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void * Js::JavascriptOperators::AllocMemForVarArray(size_t size,Recycler *recycler)

{
  char *pcVar1;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  size_t size_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)size;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&void*::typeinfo,0,size >> 3,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
             ,0x276f);
  Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  pcVar1 = Memory::Recycler::AllocZero(local_18,(size_t)recycler_local);
  return pcVar1;
}

Assistant:

void * JavascriptOperators::AllocMemForVarArray(size_t size, Recycler* recycler)
    {
        TRACK_ALLOC_INFO(recycler, Js::Var, Recycler, 0, (size_t)(size / sizeof(Js::Var)));
        return recycler->AllocZero(size);
    }